

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O1

void * rw::d3d8::destroyNativeData(void *object,int32 param_2,int32 param_3)

{
  int *piVar1;
  uint uVar2;
  undefined8 *puVar3;
  
  piVar1 = *(int **)((long)object + 0x98);
  if ((piVar1 != (int *)0x0) && (*piVar1 == 8)) {
    *(undefined8 *)((long)object + 0x98) = 0;
    if (*(short *)((long)piVar1 + 6) != 0) {
      puVar3 = (undefined8 *)(*(long *)(piVar1 + 2) + 0x28);
      uVar2 = 0;
      do {
        d3d::destroyIndexBuffer((void *)puVar3[-1]);
        d3d::destroyVertexBuffer((void *)*puVar3);
        uVar2 = uVar2 + 1;
        puVar3 = puVar3 + 7;
      } while (uVar2 < *(ushort *)((long)piVar1 + 6));
    }
    (*DAT_00149de0)(*(undefined8 *)(piVar1 + 2));
    (*DAT_00149de0)(piVar1);
  }
  return object;
}

Assistant:

void*
destroyNativeData(void *object, int32, int32)
{
	Geometry *geometry = (Geometry*)object;
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_D3D8)
		return object;
	InstanceDataHeader *header =
		(InstanceDataHeader*)geometry->instData;
	geometry->instData = nil;
	InstanceData *inst = header->inst;
	for(uint32 i = 0; i < header->numMeshes; i++){
		destroyIndexBuffer(inst->indexBuffer);
		destroyVertexBuffer(inst->vertexBuffer);
		inst++;
	}
	rwFree(header->inst);
	rwFree(header);
	return object;
}